

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

long CVariableInt::Compress(void *pSrc_,int SrcSize,void *pDst_,int DstSize)

{
  uchar *pDst;
  long lVar1;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/compression.cpp"
                 ,0x54,(uint)((SrcSize & 3U) == 0),"invalid bounds");
  lVar1 = 0;
  pDst = (uchar *)pDst_;
  while( true ) {
    if (SrcSize >> 2 == (int)lVar1) {
      return (long)pDst - (long)pDst_;
    }
    if ((long)pDst_ + ((long)DstSize - (long)pDst) < 6) break;
    pDst = Pack(pDst,*(int *)((long)pSrc_ + lVar1 * 4));
    lVar1 = lVar1 + 1;
  }
  return -1;
}

Assistant:

long CVariableInt::Compress(const void *pSrc_, int SrcSize, void *pDst_, int DstSize)
{
	dbg_assert(SrcSize % sizeof(int) == 0, "invalid bounds");

	const int *pSrc = (int *)pSrc_;
	unsigned char *pDst = (unsigned char *)pDst_;
	const unsigned char *pDstEnd = pDst + DstSize;
	SrcSize /= sizeof(int);
	while(SrcSize)
	{
		if(pDstEnd - pDst <= MAX_BYTES_PACKED)
			return -1;
		pDst = CVariableInt::Pack(pDst, *pSrc);
		SrcSize--;
		pSrc++;
	}
	return (long)(pDst - (unsigned char *)pDst_);
}